

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CurveSpanIntersection.h
# Opt level: O2

vector<double,_std::allocator<double>_> *
anurbs::CurveSpanIntersection::compute
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,CurveBase<2L> *curve,
          VectorXd *knots_u,VectorXd *knots_v,double tolerance,bool include_curve_knots)

{
  long lVar1;
  Interval *span;
  double dVar2;
  Index i;
  long lVar3;
  ParameterPoint a;
  double local_e0;
  pair<std::vector<double,_std::allocator<double>_>,_std::vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>
  local_d8;
  double t0;
  double local_98;
  double dStack_90;
  array<anurbs::CurveSpanIntersection::Axis,_2UL> axes;
  
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  CurveTessellation<2L>::compute
            (&local_d8,(CurveTessellation<2L> *)curve,(CurveBaseD *)knots_u,tolerance);
  axes._M_elems[0].m_values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  axes._M_elems[0].m_values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  axes._M_elems[0].m_values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  axes._M_elems[1].m_values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  axes._M_elems[1].m_values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  axes._M_elems[1].m_values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Axis::initialize(axes._M_elems,0,knots_u,tolerance);
  lVar3 = 1;
  Axis::initialize(axes._M_elems + 1,1,knots_v,tolerance);
  if (include_curve_knots) {
    t0 = *local_d8.first.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start;
    std::vector<double,_std::allocator<double>_>::push_back(__return_storage_ptr__,&t0);
    (*curve->_vptr_CurveBase[4])(&a,curve);
    for (dVar2 = a.first; dVar2 != (double)a._8_8_; dVar2 = (double)((long)dVar2 + 0x10)) {
      local_e0 = *(double *)((long)dVar2 + 8);
      std::vector<double,_std::allocator<double>_>::emplace_back<double>
                (__return_storage_ptr__,&local_e0);
    }
    std::_Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>::~_Vector_base
              ((_Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_> *)&a);
  }
  for (; lVar3 < (long)local_d8.second.
                       super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_d8.second.
                       super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 4; lVar3 = lVar3 + 1) {
    a.first = local_d8.first.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar3 + -1];
    a.second.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data.array[0]
         = local_d8.second.
           super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
           ._M_impl.super__Vector_impl_data._M_start[lVar3 + -1].
           super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data.array[0];
    a.second.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data.array[1]
         = local_d8.second.
           super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
           ._M_impl.super__Vector_impl_data._M_start[lVar3 + -1].
           super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data.array[1];
    t0 = local_d8.first.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start[lVar3];
    local_98 = local_d8.second.
               super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar3].
               super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data.array
               [0];
    dStack_90 = local_d8.second.
                super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
                ._M_impl.super__Vector_impl_data._M_start[lVar3].
                super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data.array
                [1];
    for (lVar1 = 0; lVar1 != 0x50; lVar1 = lVar1 + 0x28) {
      Axis::intersect((Axis *)((long)&axes._M_elems[0].m_index + lVar1),curve,&a,
                      (ParameterPoint *)&t0,__return_storage_ptr__);
    }
  }
  a.first = (double)&DAT_3e7ad7f29abcaf48;
  unique_sorted<std::vector<double,std::allocator<double>>>(__return_storage_ptr__,&a.first);
  std::array<anurbs::CurveSpanIntersection::Axis,_2UL>::~array(&axes);
  std::
  pair<std::vector<double,_std::allocator<double>_>,_std::vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>
  ::~pair(&local_d8);
  return __return_storage_ptr__;
}

Assistant:

static std::vector<double> compute(
        const CurveBase<2>& curve,
        const Eigen::VectorXd& knots_u,
        const Eigen::VectorXd& knots_v,
        const double tolerance,
        const bool include_curve_knots)
    {
        std::vector<double> intersection_parameters;

        // approximate curve with a polyline

        const auto [ts, points] = CurveTessellation<2>::compute(curve, tolerance);

        // initialize axes

        std::array<Axis, 2> axes;

        axes[0].initialize(0, knots_u, tolerance);
        axes[1].initialize(1, knots_v, tolerance);

        // add curve knots

        if (include_curve_knots) {
            double t0 = ts[0];

            intersection_parameters.push_back(t0);

            for (const auto& span : curve.spans()) {
                intersection_parameters.push_back(span.t1());
            }
        }

        // check line segments

        for (Index i = 1; i < length(points); i++) {
            const ParameterPoint a = {ts[i - 1], points[i - 1]};
            const ParameterPoint b = {ts[i], points[i]};

            for (auto& axis : axes) {
                axis.intersect(curve, a, b, intersection_parameters);
            }
        }

        unique_sorted(intersection_parameters);

        return intersection_parameters;
    }